

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboRenderTest.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::FboCases::RecreateBuffersTest::render
          (RecreateBuffersTest *this,Context *ctx,Surface *dst)

{
  FboConfig *config;
  byte bVar1;
  DataType type;
  DataType outputType;
  deUint32 dVar2;
  deUint32 dVar3;
  deUint32 program;
  GLenum GVar4;
  uint uVar5;
  uint uVar6;
  DataTypes *pDVar7;
  uint uVar8;
  undefined8 uVar9;
  int ndx;
  int iVar10;
  int iVar11;
  int in_R9D;
  GLenum GVar12;
  deUint32 buf;
  float fStack_5b4;
  ulong uStack_5b0;
  uint local_59c;
  deUint32 local_598;
  deUint32 local_594;
  Surface *local_590;
  Vector<float,_4> local_588;
  TextureFormat colorFormat;
  Framebuffer fbo;
  Vec4 fboOutBias;
  Vec4 fboOutScale;
  TextureFormatInfo fboRangeInfo;
  Vector<float,_4> local_4d8;
  FlatColorShader flatShader;
  Texture2DShader texFromFboShader;
  Texture2DShader texToFboShader;
  
  local_590 = dst;
  colorFormat = glu::mapGLInternalFormat((this->super_FboRenderCase).m_config.colorFormat);
  type = glu::getSampler2DType(colorFormat);
  outputType = FboTestUtil::getFragmentOutputType(&colorFormat);
  tcu::getTextureFormatInfo(&fboRangeInfo,&colorFormat);
  tcu::operator-((tcu *)&fboOutScale,&fboRangeInfo.valueMax,&fboRangeInfo.valueMin);
  tcu::Vector<float,_4>::Vector(&fboOutBias,&fboRangeInfo.valueMin);
  texFromFboShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader = (_func_int **)0x0;
  texFromFboShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  texFromFboShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pDVar7 = FboTestUtil::DataTypes::operator<<((DataTypes *)&texFromFboShader,TYPE_SAMPLER_2D);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&flatShader,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&fbo,0.0);
  FboTestUtil::Texture2DShader::Texture2DShader
            (&texToFboShader,pDVar7,outputType,(Vec4 *)&flatShader,(Vec4 *)&fbo);
  std::_Vector_base<glu::DataType,_std::allocator<glu::DataType>_>::~_Vector_base
            ((_Vector_base<glu::DataType,_std::allocator<glu::DataType>_> *)&texFromFboShader);
  flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader = (_func_int **)0x0;
  flatShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  flatShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pDVar7 = FboTestUtil::DataTypes::operator<<((DataTypes *)&flatShader,type);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&fbo,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&buf,0.0);
  FboTestUtil::Texture2DShader::Texture2DShader
            (&texFromFboShader,pDVar7,TYPE_FLOAT_VEC4,(Vec4 *)&fbo,(Vector<float,_4> *)&buf);
  std::_Vector_base<glu::DataType,_std::allocator<glu::DataType>_>::~_Vector_base
            ((_Vector_base<glu::DataType,_std::allocator<glu::DataType>_> *)&flatShader);
  FboTestUtil::FlatColorShader::FlatColorShader(&flatShader,outputType);
  dVar2 = (*ctx->_vptr_Context[0x75])(ctx,&texToFboShader);
  dVar3 = (*ctx->_vptr_Context[0x75])(ctx,&texFromFboShader);
  program = (*ctx->_vptr_Context[0x75])(ctx,&flatShader);
  config = &(this->super_FboRenderCase).m_config;
  uVar5 = config->buffers;
  createQuadsTex2D(ctx,2,0x1907,0x40,0x40,in_R9D);
  createMetaballsTex2D(ctx,1,0x1907,0x40,0x40,in_R9D);
  Framebuffer::Framebuffer(&fbo,ctx,config,0x80,0x80,0,0,0);
  Framebuffer::checkCompleteness(&fbo);
  FboTestUtil::Texture2DShader::setOutScaleBias(&texToFboShader,&fboOutScale,&fboOutBias);
  FboTestUtil::Texture2DShader::setTexScaleBias
            (&texFromFboShader,0,&fboRangeInfo.lookupScale,&fboRangeInfo.lookupBias);
  FboTestUtil::Texture2DShader::setUniforms(&texToFboShader,ctx,dVar2);
  FboTestUtil::Texture2DShader::setUniforms(&texFromFboShader,ctx,dVar3);
  local_4d8.m_data[0] = 0.0;
  local_4d8.m_data[1] = 0.0;
  local_4d8.m_data[2] = 1.0;
  local_4d8.m_data[3] = 1.0;
  tcu::operator*((tcu *)&local_588,&local_4d8,&fboOutScale);
  tcu::operator+((tcu *)&buf,&local_588,&fboOutBias);
  FboTestUtil::FlatColorShader::setColor(&flatShader,ctx,program,(Vec4 *)&buf);
  (*ctx->_vptr_Context[9])(ctx,0x8d40,(ulong)fbo.m_framebuffer);
  (*ctx->_vptr_Context[5])(ctx,0,0,0x80,0x80);
  buf = 0x3f800000;
  fStack_5b4 = 0.0;
  uStack_5b0 = 0x3f80000000000000;
  FboTestUtil::clearColorBuffer(ctx,&colorFormat,(Vec4 *)&buf);
  (*ctx->_vptr_Context[0x2d])(ctx,0x500);
  (*ctx->_vptr_Context[0x33])(ctx,0xb71);
  (*ctx->_vptr_Context[6])(ctx,0xde1,2);
  buf = 0xbf800000;
  fStack_5b4 = -1.0;
  uStack_5b0 = uStack_5b0 & 0xffffffff00000000;
  local_588.m_data[0] = 1.0;
  local_588.m_data[1] = 1.0;
  local_588.m_data[2] = 0.0;
  sglr::drawQuad(ctx,dVar2,(Vec3 *)&buf,(Vec3 *)&local_588);
  (*ctx->_vptr_Context[0x34])(ctx,0xb71);
  if ((uVar5 >> 10 & 1) != 0) {
    (*ctx->_vptr_Context[0x33])(ctx,0xc11);
    (*ctx->_vptr_Context[0x32])(ctx,0x20,0x20,0x40,0x40);
    (*ctx->_vptr_Context[0x2c])(ctx,1);
    (*ctx->_vptr_Context[0x2d])(ctx,0x400);
    (*ctx->_vptr_Context[0x34])(ctx,0xc11);
  }
  if (this->m_rebind == false) {
    (*ctx->_vptr_Context[9])(ctx,0x8d40,0);
  }
  local_59c = uVar5;
  local_598 = dVar2;
  local_594 = dVar3;
  iVar11 = 2;
  while (dVar3 = local_594, dVar2 = local_598, uVar5 = local_59c, iVar10 = iVar11 + -1, iVar11 != 0)
  {
    uVar5 = 0x500;
    GVar4 = fbo.m_config.depthStencilType;
    GVar12 = fbo.m_config.depthStencilFormat;
    buf = fbo.m_depthStencilBuffer;
    if (iVar11 == 2) {
      uVar5 = 0x4000;
      GVar4 = fbo.m_config.colorType;
      GVar12 = fbo.m_config.colorFormat;
      buf = fbo.m_colorBuffer;
    }
    iVar11 = iVar10;
    if ((this->m_buffers & uVar5) != 0) {
      if (GVar4 == 0x8d41) {
        (*ctx->_vptr_Context[0xe])(ctx,1,&buf);
        (*ctx->_vptr_Context[0xc])(ctx,0x8d41,(ulong)buf);
        (*ctx->_vptr_Context[0x23])(ctx,0x8d41,(ulong)GVar12,0x80,0x80);
      }
      else if (GVar4 == 0xde1) {
        (*ctx->_vptr_Context[8])(ctx,1,&buf);
        (*ctx->_vptr_Context[6])(ctx,0xde1,(ulong)buf);
        (*ctx->_vptr_Context[0x7e])(ctx,0xde1,0,(ulong)GVar12,0x80);
        (*ctx->_vptr_Context[0x1d])(ctx,0xde1,0x2801,0x2600);
        (*ctx->_vptr_Context[0x1d])(ctx,0xde1,0x2800,0x2600);
      }
    }
  }
  bVar1 = this->m_rebind;
  if ((bool)bVar1 == true) {
    iVar11 = 0;
    do {
      if (iVar11 == 0) {
        uVar9 = 0x8ce0;
        uVar8 = 0x4000;
        GVar4 = fbo.m_config.colorType;
        uVar6 = fbo.m_colorBuffer;
      }
      else {
        GVar4 = fbo.m_config.depthStencilType;
        uVar6 = fbo.m_depthStencilBuffer;
        if (iVar11 == 1) {
          uVar9 = 0x8d00;
          uVar8 = 0x100;
        }
        else {
          if (iVar11 == 3) goto LAB_00696cf1;
          uVar9 = 0x8d20;
          uVar8 = 0x400;
        }
      }
      if ((this->m_buffers & uVar8) != 0) {
        if (GVar4 == 0x8d41) {
          (*ctx->_vptr_Context[0x20])(ctx,0x8d40,uVar9,0x8d41,(ulong)uVar6);
        }
        else if (GVar4 == 0xde1) {
          (*ctx->_vptr_Context[0x1e])(ctx,0x8d40,uVar9,0xde1,(ulong)uVar6,0);
        }
      }
      iVar11 = iVar11 + 1;
    } while( true );
  }
LAB_00696cf8:
  if ((bVar1 & 1) == 0) {
    (*ctx->_vptr_Context[9])(ctx,0x8d40,(ulong)fbo.m_framebuffer);
  }
  (*ctx->_vptr_Context[0x2c])(ctx,0);
  (*ctx->_vptr_Context[0x2d])(ctx,(ulong)(this->m_buffers & 0x500));
  if ((this->m_buffers & 0x4000) != 0) {
    buf = 0xbf800000;
    fStack_5b4 = -1.0;
    uStack_5b0 = uStack_5b0 & 0xffffffff00000000;
    local_588.m_data[0] = 1.0;
    local_588.m_data[1] = 1.0;
    local_588.m_data[2] = 0.0;
    sglr::drawQuad(ctx,program,(Vec3 *)&buf,(Vec3 *)&local_588);
  }
  (*ctx->_vptr_Context[0x33])(ctx,0xb71);
  if ((uVar5 >> 10 & 1) != 0) {
    (*ctx->_vptr_Context[0x33])(ctx,0xb90);
    (*ctx->_vptr_Context[0x35])(ctx,0x202,0,0xff);
  }
  (*ctx->_vptr_Context[6])(ctx,0xde1,1);
  buf = 0xbf800000;
  fStack_5b4 = -1.0;
  uStack_5b0 = CONCAT44(uStack_5b0._4_4_,0x3f800000);
  local_588.m_data[0] = 1.0;
  local_588.m_data[1] = 1.0;
  local_588.m_data[2] = -1.0;
  sglr::drawQuad(ctx,dVar2,(Vec3 *)&buf,(Vec3 *)&local_588);
  if ((uVar5 >> 10 & 1) != 0) {
    (*ctx->_vptr_Context[0x34])(ctx,0xb90);
  }
  (*ctx->_vptr_Context[0x34])(ctx,0xb71);
  if (fbo.m_config.colorType == 0xde1) {
    (*ctx->_vptr_Context[9])(ctx,0x8d40,0);
    (*ctx->_vptr_Context[6])(ctx,0xde1,(ulong)fbo.m_colorBuffer);
    uVar5 = (*ctx->_vptr_Context[2])(ctx);
    uVar6 = (*ctx->_vptr_Context[3])(ctx);
    (*ctx->_vptr_Context[5])(ctx,0,0,(ulong)uVar5,(ulong)uVar6);
    buf = 0xbf800000;
    fStack_5b4 = -1.0;
    uStack_5b0 = uStack_5b0 & 0xffffffff00000000;
    local_588.m_data[0] = 1.0;
    local_588.m_data[1] = 1.0;
    local_588.m_data[2] = 0.0;
    sglr::drawQuad(ctx,dVar3,(Vec3 *)&buf,(Vec3 *)&local_588);
    uVar5 = (*ctx->_vptr_Context[2])(ctx);
    uVar6 = (*ctx->_vptr_Context[3])(ctx);
    (*ctx->_vptr_Context[0x80])(ctx,local_590,0,0,(ulong)uVar5,(ulong)uVar6);
  }
  else {
    FboTestUtil::readPixels
              (ctx,local_590,0,0,0x80,0x80,&colorFormat,&fboRangeInfo.lookupScale,
               &fboRangeInfo.lookupBias);
  }
  Framebuffer::~Framebuffer(&fbo);
  sglr::ShaderProgram::~ShaderProgram(&flatShader.super_ShaderProgram);
  FboTestUtil::Texture2DShader::~Texture2DShader(&texFromFboShader);
  FboTestUtil::Texture2DShader::~Texture2DShader(&texToFboShader);
  return;
LAB_00696cf1:
  bVar1 = this->m_rebind;
  goto LAB_00696cf8;
}

Assistant:

void RecreateBuffersTest::render (sglr::Context& ctx, Surface& dst)
{
	tcu::TextureFormat		colorFormat			= glu::mapGLInternalFormat(m_config.colorFormat);
	glu::DataType			fboSamplerType		= glu::getSampler2DType(colorFormat);
	glu::DataType			fboOutputType		= getFragmentOutputType(colorFormat);
	tcu::TextureFormatInfo	fboRangeInfo		= tcu::getTextureFormatInfo(colorFormat);
	Vec4					fboOutScale			= fboRangeInfo.valueMax - fboRangeInfo.valueMin;
	Vec4					fboOutBias			= fboRangeInfo.valueMin;

	Texture2DShader			texToFboShader		(DataTypes() << glu::TYPE_SAMPLER_2D, fboOutputType);
	Texture2DShader			texFromFboShader	(DataTypes() << fboSamplerType, glu::TYPE_FLOAT_VEC4);
	FlatColorShader			flatShader			(fboOutputType);
	deUint32				texToFboShaderID	= ctx.createProgram(&texToFboShader);
	deUint32				texFromFboShaderID	= ctx.createProgram(&texFromFboShader);
	deUint32				flatShaderID		= ctx.createProgram(&flatShader);

	int						width				= 128;
	int						height				= 128;
	deUint32				metaballsTex		= 1;
	deUint32				quadsTex			= 2;
	bool					stencil				= (m_config.buffers & GL_STENCIL_BUFFER_BIT) != 0;

	createQuadsTex2D(ctx, quadsTex, GL_RGB, GL_UNSIGNED_BYTE, 64, 64);
	createMetaballsTex2D(ctx, metaballsTex, GL_RGB, GL_UNSIGNED_BYTE, 64, 64);

	Framebuffer fbo(ctx, m_config, width, height);
	fbo.checkCompleteness();

	// Setup shaders
	texToFboShader.setOutScaleBias(fboOutScale, fboOutBias);
	texFromFboShader.setTexScaleBias(0, fboRangeInfo.lookupScale, fboRangeInfo.lookupBias);
	texToFboShader.setUniforms	(ctx, texToFboShaderID);
	texFromFboShader.setUniforms(ctx, texFromFboShaderID);
	flatShader.setColor			(ctx, flatShaderID, Vec4(0.0f, 0.0f, 1.0f, 1.0f) * fboOutScale + fboOutBias);

	// Draw scene
	ctx.bindFramebuffer(GL_FRAMEBUFFER, fbo.getFramebuffer());
	ctx.viewport(0, 0, width, height);
	clearColorBuffer(ctx, colorFormat, tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f));
	ctx.clear(GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

	ctx.enable(GL_DEPTH_TEST);

	ctx.bindTexture(GL_TEXTURE_2D, quadsTex);
	sglr::drawQuad(ctx, texToFboShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

	ctx.disable(GL_DEPTH_TEST);

	if (stencil)
	{
		ctx.enable(GL_SCISSOR_TEST);
		ctx.scissor(width/4, height/4, width/2, height/2);
		ctx.clearStencil(1);
		ctx.clear(GL_STENCIL_BUFFER_BIT);
		ctx.disable(GL_SCISSOR_TEST);
	}

	// Recreate buffers
	if (!m_rebind)
		ctx.bindFramebuffer(GL_FRAMEBUFFER, 0);

	DE_ASSERT((m_buffers & (GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT)) == 0 ||
			  (m_buffers & (GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT)) == (m_config.buffers & (GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT)));

	// Recreate.
	for (int ndx = 0; ndx < 2; ndx++)
	{
		deUint32	bit		= ndx == 0 ? GL_COLOR_BUFFER_BIT
									   : (GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
		deUint32	type	= ndx == 0 ? fbo.getConfig().colorType
									   : fbo.getConfig().depthStencilType;
		deUint32	format	= ndx == 0 ? fbo.getConfig().colorFormat
									   : fbo.getConfig().depthStencilFormat;
		deUint32	buf		= ndx == 0 ? fbo.getColorBuffer()
									   : fbo.getDepthStencilBuffer();

		if ((m_buffers & bit) == 0)
			continue;

		switch (type)
		{
			case GL_TEXTURE_2D:
				ctx.deleteTextures(1, &buf);
				ctx.bindTexture(GL_TEXTURE_2D, buf);
				ctx.texImage2D(GL_TEXTURE_2D, 0, format, width, height);
				ctx.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
				ctx.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
				break;

			case GL_RENDERBUFFER:
				ctx.deleteRenderbuffers(1, &buf);
				ctx.bindRenderbuffer(GL_RENDERBUFFER, buf);
				ctx.renderbufferStorage(GL_RENDERBUFFER, format, width, height);
				break;

			default:
				DE_ASSERT(false);
		}
	}

	// Rebind.
	if (m_rebind)
	{
		for (int ndx = 0; ndx < 3; ndx++)
		{
			deUint32	bit		= ndx == 0 ? GL_COLOR_BUFFER_BIT	:
								  ndx == 1 ? GL_DEPTH_BUFFER_BIT	:
								  ndx == 2 ? GL_STENCIL_BUFFER_BIT	: 0;
			deUint32	point	= ndx == 0 ? GL_COLOR_ATTACHMENT0	:
								  ndx == 1 ? GL_DEPTH_ATTACHMENT	:
								  ndx == 2 ? GL_STENCIL_ATTACHMENT	: 0;
			deUint32	type	= ndx == 0 ? fbo.getConfig().colorType
										   : fbo.getConfig().depthStencilType;
			deUint32	buf		= ndx == 0 ? fbo.getColorBuffer()
										   : fbo.getDepthStencilBuffer();

			if ((m_buffers & bit) == 0)
				continue;

			switch (type)
			{
				case GL_TEXTURE_2D:
					ctx.framebufferTexture2D(GL_FRAMEBUFFER, point, GL_TEXTURE_2D, buf, 0);
					break;

				case GL_RENDERBUFFER:
					ctx.framebufferRenderbuffer(GL_FRAMEBUFFER, point, GL_RENDERBUFFER, buf);
					break;

				default:
					DE_ASSERT(false);
			}
		}
	}

	if (!m_rebind)
		ctx.bindFramebuffer(GL_FRAMEBUFFER, fbo.getFramebuffer());

	ctx.clearStencil(0);
	ctx.clear(m_buffers & (GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT)); // \note Clear only buffers that were re-created
	if (m_buffers & GL_COLOR_BUFFER_BIT)
	{
		// Clearing of integer buffers is undefined so do clearing by rendering flat color.
		sglr::drawQuad(ctx, flatShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
	}

	ctx.enable(GL_DEPTH_TEST);

	if (stencil)
	{
		// \note Stencil test enabled only if we have stencil buffer
		ctx.enable(GL_STENCIL_TEST);
		ctx.stencilFunc(GL_EQUAL, 0, 0xffu);
	}
	ctx.bindTexture(GL_TEXTURE_2D, metaballsTex);
	sglr::drawQuad(ctx, texToFboShaderID, Vec3(-1.0f, -1.0f, 1.0f), Vec3(1.0f, 1.0f, -1.0f));
	if (stencil)
		ctx.disable(GL_STENCIL_TEST);

	ctx.disable(GL_DEPTH_TEST);

	if (fbo.getConfig().colorType == GL_TEXTURE_2D)
	{
		// Unbind fbo
		ctx.bindFramebuffer(GL_FRAMEBUFFER, 0);

		// Draw to screen
		ctx.bindTexture(GL_TEXTURE_2D, fbo.getColorBuffer());
		ctx.viewport(0, 0, ctx.getWidth(), ctx.getHeight());
		sglr::drawQuad(ctx, texFromFboShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		// Read from screen
		ctx.readPixels(dst, 0, 0, ctx.getWidth(), ctx.getHeight());
	}
	else
	{
		// Read from fbo
		readPixels(ctx, dst, 0, 0, width, height, colorFormat, fboRangeInfo.lookupScale, fboRangeInfo.lookupBias);
	}
}